

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_switch::translate
          (method_switch *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  statement_base *this_00;
  const_reference pptVar5;
  exception *e;
  exception *e_1;
  statement_default *sdptr;
  statement_case *scptr;
  statement_base **it;
  iterator __end1;
  iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  map_t<var,_statement_block_*> cases;
  statement_block *dptr;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  _Self *in_stack_fffffffffffffc08;
  compiler_type *in_stack_fffffffffffffc10;
  _Self *in_stack_fffffffffffffc18;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_fffffffffffffc20;
  key_arg<cs_impl::any> *in_stack_fffffffffffffc28;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_fffffffffffffc30;
  token_base *in_stack_fffffffffffffc38;
  context_t *in_stack_fffffffffffffc40;
  statement_block *in_stack_fffffffffffffc48;
  map_t<var,_statement_block_*> *in_stack_fffffffffffffc50;
  tree_type<cs::token_base_*> *in_stack_fffffffffffffc58;
  statement_switch *in_stack_fffffffffffffc60;
  allocator *paVar6;
  allocator_type *in_stack_fffffffffffffc78;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffc80;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffc88;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffc90;
  shared_ptr<cs::context_type> local_320 [12];
  undefined1 local_25a;
  allocator local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [32];
  statement_default *local_210;
  statement_block *local_1f0;
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  statement_case *local_1c0;
  reference local_1b8;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_190;
  undefined1 *local_170;
  statement_block *local_138;
  undefined1 local_68 [104];
  
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x56430c);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x564319);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x564321);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffc08);
  std::operator+(in_stack_fffffffffffffc18,(difference_type)in_stack_fffffffffffffc10);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         *)in_stack_fffffffffffffc08);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x56439a
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc78);
  compiler_type::translate
            (in_stack_fffffffffffffc10,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffc08,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x5643de);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)in_stack_fffffffffffffc60);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x5643fa
            );
  local_138 = (statement_block *)0x0;
  phmap::
  flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  ::flat_hash_map((flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                   *)0x564413);
  local_170 = local_68;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffc08);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffc08);
  do {
    bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    if (!bVar1) {
      this_00 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffc10);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               *)this_00);
      pptVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                          ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                           in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08);
      token_expr::get_tree((token_expr *)*pptVar5);
      tree_type<cs::token_base_*>::tree_type
                ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc10,
                 (tree_type<cs::token_base_*> *)in_stack_fffffffffffffc08);
      phmap::
      flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
      ::flat_hash_map((flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                       *)in_stack_fffffffffffffc10,
                      (flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                       *)in_stack_fffffffffffffc08);
      std::shared_ptr<cs::context_type>::shared_ptr
                (local_320,(shared_ptr<cs::context_type> *)local_138);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               *)this_00);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
      statement_switch::statement_switch
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x564c51);
      phmap::
      flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
      ::~flat_hash_map((flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                        *)0x564c5e);
      tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x564c6b);
      phmap::
      flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
      ::~flat_hash_map((flat_hash_map<cs_impl::any,_cs::statement_block_*,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                        *)0x564c78);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffc60);
      return this_00;
    }
    local_1b8 = std::
                _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                ::operator*(&local_190);
    iVar2 = (*(*local_1b8)->_vptr_statement_base[2])();
    if (iVar2 == 0xd) {
      local_1c0 = (statement_case *)*local_1b8;
      statement_case::get_tag(local_1c0);
      sVar3 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
              ::count<cs_impl::any>(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      if (sVar3 != 0) {
        local_1e2 = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e0,"Redefinition of case.",&local_1e1);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffffc10,(string *)in_stack_fffffffffffffc08);
        local_1e2 = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      statement_case::get_tag(local_1c0);
      local_1f0 = statement_case::get_block(local_1c0);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
      ::emplace<const_cs_impl::any_&,_cs::statement_block_*,_0>
                (in_stack_fffffffffffffc20,(any *)in_stack_fffffffffffffc18,
                 (statement_block **)in_stack_fffffffffffffc10);
    }
    else {
      iVar2 = (*(*local_1b8)->_vptr_statement_base[2])();
      if (iVar2 != 0xe) {
        local_25a = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        paVar6 = &local_259;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_258,"Unexpected statement in switch definition.",paVar6);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffffc10,(string *)in_stack_fffffffffffffc08);
        local_25a = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_210 = (statement_default *)*local_1b8;
      if (local_138 != (statement_block *)0x0) {
        local_232 = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        paVar6 = &local_231;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_230,"Redefinition of default case.",paVar6);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffffc10,(string *)in_stack_fffffffffffffc08);
        local_232 = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_138 = statement_default::get_block(local_210);
    }
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                *)in_stack_fffffffffffffc10);
  } while( true );
}

Assistant:

statement_base *
	method_switch::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		statement_block *dptr = nullptr;
		map_t<var, statement_block *> cases;
		for (auto &it: body) {
			try {
				if (it->get_type() == statement_types::case_) {
					auto *scptr = static_cast<statement_case *>(it);
					if (cases.count(scptr->get_tag()) > 0)
						throw compile_error("Redefinition of case.");
					cases.emplace(scptr->get_tag(), scptr->get_block());
				}
				else if (it->get_type() == statement_types::default_) {
					auto *sdptr = static_cast<statement_default *>(it);
					if (dptr != nullptr)
						throw compile_error("Redefinition of default case.");
					dptr = sdptr->get_block();
				}
				else
					throw compile_error("Unexpected statement in switch definition.");
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(it->get_line_num(), it->get_file_path(), it->get_raw_code(), e.what());
			}
		}
		return new statement_switch(static_cast<token_expr *>(raw.front().at(1))->get_tree(), cases, dptr, context,
		                            raw.front().back());
	}